

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O0

siphash * sip24_init(siphash *H,sipkey *key)

{
  sipkey *key_local;
  siphash *H_local;
  
  H->v0 = key->k[0] ^ 0x736f6d6570736575;
  H->v1 = key->k[1] ^ 0x646f72616e646f6d;
  H->v2 = key->k[0] ^ 0x6c7967656e657261;
  H->v3 = key->k[1] ^ 0x7465646279746573;
  H->p = H->buf;
  H->c = 0;
  return H;
}

Assistant:

static struct siphash *
sip24_init(struct siphash *H, const struct sipkey *key) {
  H->v0 = SIP_ULL(0x736f6d65U, 0x70736575U) ^ key->k[0];
  H->v1 = SIP_ULL(0x646f7261U, 0x6e646f6dU) ^ key->k[1];
  H->v2 = SIP_ULL(0x6c796765U, 0x6e657261U) ^ key->k[0];
  H->v3 = SIP_ULL(0x74656462U, 0x79746573U) ^ key->k[1];

  H->p = H->buf;
  H->c = 0;

  return H;
}